

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPA.cpp
# Opt level: O0

void __thiscall OpenMD::NPA::scaleSimBox(NPA *this)

{
  double dVar1;
  double *pdVar2;
  SquareMatrix3<double> *in_RDI;
  SquareMatrix3<double> *this_00;
  Mat3x3d hmat;
  int j;
  int i;
  Mat3x3d scaleMat;
  Snapshot *in_stack_fffffffffffffec8;
  SquareMatrix3<double> *in_stack_ffffffffffffff08;
  Mat3x3d *in_stack_ffffffffffffff58;
  Snapshot *in_stack_ffffffffffffff60;
  uint local_58;
  uint local_54;
  RectMatrix<double,_3U,_3U> local_50;
  
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x210f09);
  for (local_54 = 0; (int)local_54 < 3; local_54 = local_54 + 1) {
    for (local_58 = 0; (int)local_58 < 3; local_58 = local_58 + 1) {
      pdVar2 = RectMatrix<double,_3U,_3U>::operator()(&local_50,local_54,local_58);
      *pdVar2 = 0.0;
      if (local_54 == local_58) {
        pdVar2 = RectMatrix<double,_3U,_3U>::operator()(&local_50,local_54,local_58);
        *pdVar2 = 1.0;
      }
    }
  }
  dVar1 = (in_RDI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][1];
  pdVar2 = RectMatrix<double,_3U,_3U>::operator()
                     ((RectMatrix<double,_3U,_3U> *)
                      (in_RDI[7].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                       data_[0] + 2),2,2);
  this_00 = (SquareMatrix3<double> *)exp(dVar1 * *pdVar2);
  pdVar2 = RectMatrix<double,_3U,_3U>::operator()(&local_50,2,2);
  *pdVar2 = (double)this_00;
  Snapshot::getHmat(in_stack_fffffffffffffec8);
  OpenMD::operator*(in_stack_ffffffffffffff08,in_RDI);
  SquareMatrix3<double>::operator=(this_00,(SquareMatrix3<double> *)in_stack_fffffffffffffec8);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2110be);
  Snapshot::setHmat(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2110e6);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2110f3);
  return;
}

Assistant:

void NPA::scaleSimBox() {
    Mat3x3d scaleMat;

    for (int i = 0; i < 3; i++) {
      for (int j = 0; j < 3; j++) {
        scaleMat(i, j) = 0.0;
        if (i == j) { scaleMat(i, j) = 1.0; }
      }
    }

    scaleMat(2, 2) = exp(dt * eta(2, 2));
    Mat3x3d hmat   = snap->getHmat();
    hmat           = hmat * scaleMat;
    snap->setHmat(hmat);
  }